

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  ParseLocation location;
  bool bVar1;
  undefined1 uVar2;
  Type TVar3;
  CppType CVar4;
  Token *pTVar5;
  Descriptor *this_00;
  undefined8 in_RSI;
  long in_RDI;
  MessageFactory *factory;
  string tmp;
  bool consumed_semicolon;
  FieldDescriptor *other_field;
  OneofDescriptor *oneof;
  string lower_field_name_1;
  string lower_field_name;
  int32 field_number;
  Descriptor *value_descriptor;
  string serialized_value;
  string prefix;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  bool reserved_field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  undefined4 in_stack_fffffffffffff508;
  TokenType in_stack_fffffffffffff50c;
  ParserImpl *in_stack_fffffffffffff510;
  FieldDescriptor *field_00;
  ParserImpl *in_stack_fffffffffffff518;
  ParseInfoTree *info_tree;
  undefined7 in_stack_fffffffffffff520;
  undefined1 in_stack_fffffffffffff527;
  Reflection *in_stack_fffffffffffff528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff530;
  allocator *paVar6;
  undefined7 in_stack_fffffffffffff538;
  undefined1 in_stack_fffffffffffff53f;
  string *in_stack_fffffffffffff540;
  undefined6 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54e;
  undefined1 in_stack_fffffffffffff54f;
  CppType in_stack_fffffffffffff550;
  uint in_stack_fffffffffffff554;
  Reflection *in_stack_fffffffffffff558;
  string *in_stack_fffffffffffff580;
  undefined6 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58e;
  undefined1 in_stack_fffffffffffff58f;
  Message *in_stack_fffffffffffff590;
  undefined5 in_stack_fffffffffffff598;
  undefined1 in_stack_fffffffffffff59d;
  byte bVar7;
  undefined1 in_stack_fffffffffffff59e;
  undefined1 in_stack_fffffffffffff59f;
  string *in_stack_fffffffffffff5b0;
  ParserImpl *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5df;
  string *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  undefined2 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff612;
  undefined1 in_stack_fffffffffffff613;
  undefined1 in_stack_fffffffffffff614;
  undefined1 in_stack_fffffffffffff615;
  undefined1 in_stack_fffffffffffff616;
  undefined1 in_stack_fffffffffffff617;
  Reflection *in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  ParserImpl *in_stack_fffffffffffff628;
  byte local_9ca;
  string *in_stack_fffffffffffff638;
  Descriptor *in_stack_fffffffffffff640;
  ParserImpl *in_stack_fffffffffffff648;
  ParseInfoTree *local_958;
  ParseInfoTree *local_928;
  ParserImpl *in_stack_fffffffffffff718;
  Descriptor *local_8b0;
  bool local_861;
  ParseLocation local_848;
  string local_840 [32];
  string local_820 [37];
  byte local_7fb;
  byte local_7fa;
  allocator local_7f9;
  string local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [39];
  undefined1 local_7a9 [40];
  allocator local_781;
  string local_780 [39];
  allocator local_759;
  string local_758 [37];
  byte local_733;
  byte local_732;
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  undefined8 local_6e8;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [8];
  FieldDescriptor *in_stack_fffffffffffff950;
  Reflection *in_stack_fffffffffffff958;
  Message *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  byte in_stack_fffffffffffff96f;
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  FieldDescriptor *local_5d0;
  OneofDescriptor *local_5c8;
  string local_5c0 [32];
  string local_5a0 [37];
  byte local_57b;
  byte local_57a;
  allocator local_579;
  string local_578 [37];
  byte local_553;
  byte local_552;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [39];
  byte local_501;
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [36];
  undefined4 local_384;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  Descriptor *local_168;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [36];
  int local_ec;
  string local_e8 [32];
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [64];
  ColumnNumber local_60;
  int local_5c;
  ParseInfoTree *local_58;
  byte local_49;
  string local_48 [32];
  Descriptor *local_28;
  Reflection *local_20;
  undefined8 local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_20 = Message::GetReflection((Message *)in_stack_fffffffffffff510);
  local_28 = Message::GetDescriptor((Message *)in_stack_fffffffffffff510);
  std::__cxx11::string::string(local_48);
  local_49 = 0;
  local_58 = (ParseInfoTree *)0x0;
  pTVar5 = io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
  local_5c = pTVar5->line;
  pTVar5 = io::Tokenizer::current((Tokenizer *)(in_RDI + 0x28));
  local_60 = pTVar5->column;
  local_a2 = 0;
  local_a3 = 0;
  bVar1 = internal::GetAnyFieldDescriptors
                    ((Message *)in_stack_fffffffffffff528,
                     (FieldDescriptor **)
                     CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                     (FieldDescriptor **)in_stack_fffffffffffff518);
  local_861 = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string(local_a0,"[",&local_a1);
    local_a3 = 1;
    local_861 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if (local_861 != false) {
    std::__cxx11::string::string(local_c8);
    std::__cxx11::string::string(local_e8);
    bVar1 = ConsumeAnyTypeUrl((ParserImpl *)
                              CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                              in_stack_fffffffffffff5e0,
                              (string *)
                              CONCAT17(in_stack_fffffffffffff5df,in_stack_fffffffffffff5d8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"]",&local_111);
      bVar1 = Consume(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_138,":",&local_139);
        TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        std::__cxx11::string::string(local_160);
        if (*(long *)(in_RDI + 8) == 0) {
          local_8b0 = anon_unknown_19::DefaultFinderFindAnyType
                                ((Message *)in_stack_fffffffffffff518,
                                 (string *)in_stack_fffffffffffff510,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        }
        else {
          local_8b0 = (Descriptor *)
                      (**(code **)(**(long **)(in_RDI + 8) + 0x20))
                                (*(long **)(in_RDI + 8),local_18,local_e8,local_c8);
        }
        local_168 = local_8b0;
        if (local_8b0 == (Descriptor *)0x0) {
          std::operator+((char *)in_stack_fffffffffffff558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff518,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff510);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
          ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                      (string *)in_stack_fffffffffffff518);
          std::__cxx11::string::~string(local_188);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_1c8);
          local_1 = 0;
        }
        else {
          bVar1 = ConsumeAnyValue(in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                                  in_stack_fffffffffffff638);
          if (bVar1) {
            if ((*(int *)(in_RDI + 0xf0) != 1) ||
               (((bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x456c76), bVar1 ||
                 (bVar1 = Reflection::HasField
                                    (in_stack_fffffffffffff528,
                                     (Message *)
                                     CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                                     (FieldDescriptor *)in_stack_fffffffffffff518), !bVar1)) &&
                ((bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x456ccc), bVar1 ||
                 (bVar1 = Reflection::HasField
                                    (in_stack_fffffffffffff528,
                                     (Message *)
                                     CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                                     (FieldDescriptor *)in_stack_fffffffffffff518), !bVar1)))))) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538),
                             in_stack_fffffffffffff530);
              Reflection::SetString
                        ((Reflection *)
                         CONCAT17(in_stack_fffffffffffff59f,
                                  CONCAT16(in_stack_fffffffffffff59e,
                                           CONCAT15(in_stack_fffffffffffff59d,
                                                    in_stack_fffffffffffff598))),
                         in_stack_fffffffffffff590,
                         (FieldDescriptor *)
                         CONCAT17(in_stack_fffffffffffff58f,
                                  CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588)),
                         in_stack_fffffffffffff580);
              std::__cxx11::string::~string(local_210);
              std::__cxx11::string::string(local_230,local_160);
              Reflection::SetString
                        ((Reflection *)
                         CONCAT17(in_stack_fffffffffffff59f,
                                  CONCAT16(in_stack_fffffffffffff59e,
                                           CONCAT15(in_stack_fffffffffffff59d,
                                                    in_stack_fffffffffffff598))),
                         in_stack_fffffffffffff590,
                         (FieldDescriptor *)
                         CONCAT17(in_stack_fffffffffffff58f,
                                  CONCAT16(in_stack_fffffffffffff58e,in_stack_fffffffffffff588)),
                         in_stack_fffffffffffff580);
              std::__cxx11::string::~string(local_230);
              local_1 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_1e8,"Non-repeated Any specified multiple times.",&local_1e9);
              ReportError((ParserImpl *)
                          CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                          (string *)in_stack_fffffffffffff518);
              std::__cxx11::string::~string(local_1e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
              local_1 = 0;
            }
          }
          else {
            local_1 = 0;
          }
        }
        local_ec = 1;
        std::__cxx11::string::~string(local_160);
      }
      else {
        local_1 = 0;
        local_ec = 1;
      }
    }
    else {
      local_1 = 0;
      local_ec = 1;
    }
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    goto LAB_0045910c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"[",&local_251);
  bVar1 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  if (bVar1) {
    bVar1 = ConsumeFullTypeName((ParserImpl *)
                                CONCAT17(in_stack_fffffffffffff58f,
                                         CONCAT16(in_stack_fffffffffffff58e,
                                                  in_stack_fffffffffffff588)),
                                in_stack_fffffffffffff580);
    if (!bVar1) {
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"]",&local_279);
    bVar1 = Consume(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    if (!bVar1) {
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
    if (*(long *)(in_RDI + 8) == 0) {
      local_928 = (ParseInfoTree *)
                  anon_unknown_19::DefaultFinderFindExtension
                            ((Message *)in_stack_fffffffffffff510,
                             (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)
                            );
    }
    else {
      local_928 = (ParseInfoTree *)
                  (**(code **)(**(long **)(in_RDI + 8) + 0x10))
                            (*(long **)(in_RDI + 8),local_18,local_48);
    }
    local_58 = local_928;
    if (local_928 == (ParseInfoTree *)0x0) {
      if (((*(byte *)(in_RDI + 0xf5) & 1) == 0) && ((*(byte *)(in_RDI + 0xf6) & 1) == 0)) {
        std::operator+((char *)in_stack_fffffffffffff558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
        Descriptor::full_name_abi_cxx11_(local_28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
        ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                    (string *)in_stack_fffffffffffff518);
        std::__cxx11::string::~string(local_2a0);
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::string::~string(local_2e0);
        std::__cxx11::string::~string(local_300);
        local_1 = 0;
        local_ec = 1;
        goto LAB_0045910c;
      }
      std::operator+((char *)in_stack_fffffffffffff558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      Descriptor::full_name_abi_cxx11_(local_28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      ReportWarning((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                    (string *)in_stack_fffffffffffff518);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_380);
    }
  }
  else {
    bVar1 = ConsumeIdentifier((ParserImpl *)
                              CONCAT17(in_stack_fffffffffffff54f,
                                       CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)
                                      ),in_stack_fffffffffffff540);
    if (!bVar1) {
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
    if (((*(byte *)(in_RDI + 0xf8) & 1) == 0) ||
       (bVar1 = safe_strto32(in_stack_fffffffffffff540,
                             (int32 *)CONCAT17(in_stack_fffffffffffff53f,in_stack_fffffffffffff538))
       , !bVar1)) {
      local_58 = (ParseInfoTree *)
                 Descriptor::FindFieldByName
                           ((Descriptor *)in_stack_fffffffffffff528,
                            (string *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520))
      ;
      if (local_58 == (ParseInfoTree *)0x0) {
        std::__cxx11::string::string(local_3a8,local_48);
        LowerString((string *)in_stack_fffffffffffff510);
        local_58 = (ParseInfoTree *)
                   Descriptor::FindFieldByName
                             ((Descriptor *)in_stack_fffffffffffff528,
                              (string *)
                              CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520));
        if ((local_58 != (ParseInfoTree *)0x0) &&
           (TVar3 = FieldDescriptor::type
                              ((FieldDescriptor *)
                               CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520)),
           TVar3 != TYPE_GROUP)) {
          local_58 = (ParseInfoTree *)0x0;
        }
        std::__cxx11::string::~string(local_3a8);
      }
      if ((local_58 != (ParseInfoTree *)0x0) &&
         (TVar3 = FieldDescriptor::type
                            ((FieldDescriptor *)
                             CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520)),
         TVar3 == TYPE_GROUP)) {
        this_00 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff510);
        Descriptor::name_abi_cxx11_(this_00);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff510,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        if (bVar1) {
          local_58 = (ParseInfoTree *)0x0;
        }
      }
      if ((local_58 == (ParseInfoTree *)0x0) && ((*(byte *)(in_RDI + 0xf4) & 1) != 0)) {
        std::__cxx11::string::string(local_3c8,local_48);
        LowerString((string *)in_stack_fffffffffffff510);
        local_58 = (ParseInfoTree *)
                   Descriptor::FindFieldByLowercaseName
                             ((Descriptor *)in_stack_fffffffffffff518,
                              (string *)in_stack_fffffffffffff510);
        std::__cxx11::string::~string(local_3c8);
      }
      if (local_58 == (ParseInfoTree *)0x0) {
        local_49 = Descriptor::IsReservedName
                             ((Descriptor *)in_stack_fffffffffffff528,
                              (string *)
                              CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520));
      }
    }
    else {
      bVar1 = Descriptor::IsExtensionNumber
                        ((Descriptor *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      if (bVar1) {
        if (*(long *)(in_RDI + 8) == 0) {
          local_958 = (ParseInfoTree *)
                      anon_unknown_19::DefaultFinderFindExtensionByNumber
                                ((Descriptor *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
        }
        else {
          local_958 = (ParseInfoTree *)
                      (**(code **)(**(long **)(in_RDI + 8) + 0x18))
                                (*(long **)(in_RDI + 8),local_28,local_384);
        }
        local_58 = local_958;
      }
      else {
        bVar1 = Descriptor::IsReservedNumber
                          ((Descriptor *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
        if (bVar1) {
          local_49 = 1;
        }
        else {
          local_58 = (ParseInfoTree *)
                     Descriptor::FindFieldByNumber
                               ((Descriptor *)in_stack_fffffffffffff518,
                                (int)((ulong)in_stack_fffffffffffff510 >> 0x20));
        }
      }
    }
    if ((local_58 == (ParseInfoTree *)0x0) && ((local_49 & 1) == 0)) {
      if ((*(byte *)(in_RDI + 0xf5) & 1) == 0) {
        Descriptor::full_name_abi_cxx11_(local_28);
        std::operator+((char *)in_stack_fffffffffffff558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
        ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                    (string *)in_stack_fffffffffffff518);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::~string(local_408);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::string::~string(local_448);
        local_1 = 0;
        local_ec = 1;
        goto LAB_0045910c;
      }
      Descriptor::full_name_abi_cxx11_(local_28);
      std::operator+((char *)in_stack_fffffffffffff558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      ReportWarning((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                    (string *)in_stack_fffffffffffff518);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::string::~string(local_4c8);
    }
  }
  if (local_58 == (ParseInfoTree *)0x0) {
    local_501 = 0;
    if ((((*(byte *)(in_RDI + 0xf5) & 1) == 0) && ((*(byte *)(in_RDI + 0xf6) & 1) == 0)) &&
       ((local_49 & 1) == 0)) {
      internal::LogMessage::LogMessage
                ((LogMessage *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffff518 >> 0x20),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
      local_501 = 1;
      internal::LogMessage::operator<<
                ((LogMessage *)in_stack_fffffffffffff510,
                 (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffff510,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    }
    if ((local_501 & 1) != 0) {
      internal::LogMessage::~LogMessage((LogMessage *)0x457d3e);
    }
    paVar6 = &local_529;
    std::allocator<char>::allocator();
    local_552 = 0;
    local_553 = 0;
    local_57a = 0;
    local_57b = 0;
    std::__cxx11::string::string(local_528,":",paVar6);
    bVar1 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
    local_9ca = 0;
    if (bVar1) {
      paVar6 = &local_551;
      std::allocator<char>::allocator();
      local_552 = 1;
      std::__cxx11::string::string(local_550,"{",paVar6);
      local_553 = 1;
      bVar1 = LookingAt(in_stack_fffffffffffff510,
                        (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_9ca = 0;
      if (!bVar1) {
        paVar6 = &local_579;
        std::allocator<char>::allocator();
        local_57a = 1;
        std::__cxx11::string::string(local_578,"<",paVar6);
        local_57b = 1;
        bVar1 = LookingAt(in_stack_fffffffffffff510,
                          (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        local_9ca = bVar1 ^ 0xff;
      }
    }
    if ((local_57b & 1) != 0) {
      std::__cxx11::string::~string(local_578);
    }
    if ((local_57a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_579);
    }
    if ((local_553 & 1) != 0) {
      std::__cxx11::string::~string(local_550);
    }
    if ((local_552 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_551);
    }
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    if ((local_9ca & 1) == 0) {
      local_1 = SkipFieldMessage(in_stack_fffffffffffff5b8);
      local_ec = 1;
    }
    else {
      local_1 = SkipFieldValue(in_stack_fffffffffffff718);
      local_ec = 1;
    }
    goto LAB_0045910c;
  }
  if (*(int *)(in_RDI + 0xf0) == 1) {
    in_stack_fffffffffffff613 = FieldDescriptor::is_repeated((FieldDescriptor *)0x458124);
    if ((!(bool)in_stack_fffffffffffff613) &&
       (in_stack_fffffffffffff612 =
             Reflection::HasField
                       (in_stack_fffffffffffff528,
                        (Message *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                        (FieldDescriptor *)in_stack_fffffffffffff518),
       (bool)in_stack_fffffffffffff612)) {
      std::operator+((char *)in_stack_fffffffffffff558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                  (string *)in_stack_fffffffffffff518);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_5c0);
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
    local_5c8 = FieldDescriptor::containing_oneof((FieldDescriptor *)local_58);
    if ((local_5c8 != (OneofDescriptor *)0x0) &&
       (bVar1 = Reflection::HasOneof
                          ((Reflection *)in_stack_fffffffffffff510,
                           (Message *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                           (OneofDescriptor *)0x458295), bVar1)) {
      local_5d0 = Reflection::GetOneofFieldDescriptor
                            (in_stack_fffffffffffff528,
                             (Message *)
                             CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                             (OneofDescriptor *)in_stack_fffffffffffff518);
      std::operator+((char *)in_stack_fffffffffffff558,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      FieldDescriptor::name_abi_cxx11_(local_5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      OneofDescriptor::name_abi_cxx11_(local_5c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
      ReportError((ParserImpl *)CONCAT17(in_stack_fffffffffffff527,in_stack_fffffffffffff520),
                  (string *)in_stack_fffffffffffff518);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::string::~string(local_610);
      std::__cxx11::string::~string(local_630);
      std::__cxx11::string::~string(local_650);
      std::__cxx11::string::~string(local_670);
      std::__cxx11::string::~string(local_690);
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
  }
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x458521);
  if (CVar4 == CPPTYPE_MESSAGE) {
    paVar6 = &local_6b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6b8,":",paVar6);
    in_stack_fffffffffffff96f =
         TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
    std::__cxx11::string::~string(local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    in_stack_fffffffffffff96f = in_stack_fffffffffffff96f & 1;
    if (in_stack_fffffffffffff96f == 0) goto LAB_004588b0;
    FieldDescriptor::options((FieldDescriptor *)local_58);
    bVar1 = FieldOptions::weak((FieldOptions *)0x4585e7);
    if ((!bVar1) ||
       (bVar1 = LookingAtType(in_stack_fffffffffffff510,in_stack_fffffffffffff50c), !bVar1))
    goto LAB_004588b0;
    std::__cxx11::string::string(local_6e0);
    bVar1 = ConsumeString((ParserImpl *)
                          CONCAT17(in_stack_fffffffffffff54f,
                                   CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)),
                          in_stack_fffffffffffff540);
    if (bVar1) {
      if (*(long *)(in_RDI + 8) == 0) {
        local_6e8 = 0;
      }
      else {
        local_6e8 = (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),local_58);
      }
      Reflection::MutableMessage
                (in_stack_fffffffffffff558,
                 (Message *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                 (FieldDescriptor *)
                 CONCAT17(in_stack_fffffffffffff54f,
                          CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)),
                 (MessageFactory *)in_stack_fffffffffffff540);
      MessageLite::ParseFromString
                ((MessageLite *)in_stack_fffffffffffff510,
                 (string *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_ec = 2;
    }
    else {
      local_1 = 0;
      local_ec = 1;
    }
    std::__cxx11::string::~string(local_6e0);
    if (local_ec != 2) goto LAB_0045910c;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,":",&local_709);
    bVar7 = Consume(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    if ((bVar7 & 1) == 0) {
      local_1 = 0;
      local_ec = 1;
      goto LAB_0045910c;
    }
LAB_004588b0:
    local_732 = 0;
    local_733 = 0;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4588cd);
    bVar7 = false;
    if (bVar1) {
      paVar6 = &local_731;
      std::allocator<char>::allocator();
      local_732 = 1;
      std::__cxx11::string::string(local_730,"[",paVar6);
      local_733 = 1;
      bVar7 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
    }
    if ((local_733 & 1) != 0) {
      std::__cxx11::string::~string(local_730);
    }
    if ((local_732 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_731);
    }
    if ((bVar7 & 1) == 0) {
      in_stack_fffffffffffff550 = FieldDescriptor::cpp_type((FieldDescriptor *)0x458d41);
      if (in_stack_fffffffffffff550 == CPPTYPE_MESSAGE) {
        bVar1 = ConsumeFieldMessage(in_stack_fffffffffffff628,
                                    (Message *)
                                    CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
                                    in_stack_fffffffffffff618,
                                    (FieldDescriptor *)
                                    CONCAT17(in_stack_fffffffffffff617,
                                             CONCAT16(in_stack_fffffffffffff616,
                                                      CONCAT15(in_stack_fffffffffffff615,
                                                               CONCAT14(in_stack_fffffffffffff614,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffff613,
                                                  CONCAT12(in_stack_fffffffffffff612,
                                                           in_stack_fffffffffffff610)))))));
        if (!bVar1) {
          local_1 = 0;
          local_ec = 1;
          goto LAB_0045910c;
        }
      }
      else {
        bVar1 = ConsumeFieldValue((ParserImpl *)
                                  CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                                  in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                                  in_stack_fffffffffffff950);
        if (!bVar1) {
          local_1 = 0;
          local_ec = 1;
          goto LAB_0045910c;
        }
      }
    }
    else {
      paVar6 = &local_759;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_758,"]",paVar6);
      bVar1 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
      std::__cxx11::string::~string(local_758);
      std::allocator<char>::~allocator((allocator<char> *)&local_759);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        do {
          CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)0x458a38);
          if (CVar4 == CPPTYPE_MESSAGE) {
            bVar1 = ConsumeFieldMessage(in_stack_fffffffffffff628,
                                        (Message *)
                                        CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620
                                                ),in_stack_fffffffffffff618,
                                        (FieldDescriptor *)
                                        CONCAT17(in_stack_fffffffffffff617,
                                                 CONCAT16(in_stack_fffffffffffff616,
                                                          CONCAT15(in_stack_fffffffffffff615,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff614,
                                                  CONCAT13(in_stack_fffffffffffff613,
                                                           CONCAT12(in_stack_fffffffffffff612,
                                                                    in_stack_fffffffffffff610)))))))
            ;
            if (!bVar1) {
              local_1 = 0;
              local_ec = 1;
              goto LAB_0045910c;
            }
          }
          else {
            bVar1 = ConsumeFieldValue((ParserImpl *)
                                      CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),
                                      in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                                      in_stack_fffffffffffff950);
            if (!bVar1) {
              local_1 = 0;
              local_ec = 1;
              goto LAB_0045910c;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_780,"]",&local_781);
          bVar1 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
          std::__cxx11::string::~string(local_780);
          std::allocator<char>::~allocator((allocator<char> *)&local_781);
          if (bVar1) goto LAB_00458df6;
          in_stack_fffffffffffff558 = (Reflection *)local_7a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_7a9 + 1),",",(allocator *)in_stack_fffffffffffff558);
          bVar1 = Consume(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
          in_stack_fffffffffffff554 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff554);
          std::__cxx11::string::~string((string *)(local_7a9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_7a9);
        } while ((in_stack_fffffffffffff554 & 0x1000000) != 0);
        local_1 = 0;
        local_ec = 1;
        goto LAB_0045910c;
      }
    }
  }
LAB_00458df6:
  paVar6 = &local_7d1;
  std::allocator<char>::allocator();
  local_7fa = 0;
  local_7fb = 0;
  std::__cxx11::string::string(local_7d0,";",paVar6);
  bVar1 = TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
  if (!bVar1) {
    paVar6 = &local_7f9;
    std::allocator<char>::allocator();
    local_7fa = 1;
    std::__cxx11::string::string(local_7f8,",",paVar6);
    local_7fb = 1;
    TryConsume(in_stack_fffffffffffff518,(string *)in_stack_fffffffffffff510);
  }
  if ((local_7fb & 1) != 0) {
    std::__cxx11::string::~string(local_7f8);
  }
  if ((local_7fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  }
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  FieldDescriptor::options((FieldDescriptor *)local_58);
  uVar2 = FieldOptions::deprecated((FieldOptions *)0x458f18);
  if ((bool)uVar2) {
    std::operator+((char *)in_stack_fffffffffffff558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff518,(char *)in_stack_fffffffffffff510);
    ReportWarning((ParserImpl *)CONCAT17(uVar2,in_stack_fffffffffffff520),
                  (string *)in_stack_fffffffffffff518);
    std::__cxx11::string::~string(local_820);
    std::__cxx11::string::~string(local_840);
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    field_00 = *(FieldDescriptor **)(in_RDI + 0x10);
    info_tree = local_58;
    ParseLocation::ParseLocation(&local_848,local_5c,local_60);
    location.column._3_1_ = uVar2;
    location._0_7_ = in_stack_fffffffffffff520;
    RecordLocation(info_tree,field_00,location);
  }
  local_1 = 1;
  local_ec = 1;
LAB_0045910c:
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }